

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeDisplay.cpp
# Opt level: O0

void __thiscall
eglu::NativeDisplayFactory::NativeDisplayFactory
          (NativeDisplayFactory *this,string *name,string *description,Capability capabilities,
          EGLenum platformType,char *platformExtension)

{
  char *__s;
  allocator<char> local_3d [13];
  char *local_30;
  char *platformExtension_local;
  EGLenum platformType_local;
  Capability capabilities_local;
  string *description_local;
  string *name_local;
  NativeDisplayFactory *this_local;
  
  local_30 = platformExtension;
  platformExtension_local._0_4_ = platformType;
  platformExtension_local._4_4_ = capabilities;
  _platformType_local = description;
  description_local = name;
  name_local = (string *)this;
  tcu::FactoryBase::FactoryBase(&this->super_FactoryBase,name,description);
  (this->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory =
       (_func_int **)&PTR__NativeDisplayFactory_0327fa68;
  tcu::FactoryRegistry<eglu::NativeWindowFactory>::FactoryRegistry(&this->m_nativeWindowRegistry);
  tcu::FactoryRegistry<eglu::NativePixmapFactory>::FactoryRegistry(&this->m_nativePixmapRegistry);
  __s = local_30;
  this->m_capabilities = platformExtension_local._4_4_;
  this->m_platformType = (EGLenum)platformExtension_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_platformExtension,__s,local_3d);
  std::allocator<char>::~allocator(local_3d);
  return;
}

Assistant:

NativeDisplayFactory::NativeDisplayFactory (const std::string& name, const std::string& description, NativeDisplay::Capability capabilities, EGLenum platformType, const char* platformExtension)
	: FactoryBase			(name, description)
	, m_capabilities		(capabilities)
	, m_platformType		(platformType)
	, m_platformExtension	(platformExtension)
{
	DE_ASSERT(platformType != EGL_NONE && platformExtension);
	DE_ASSERT(capabilities & NativeDisplay::CAPABILITY_GET_DISPLAY_PLATFORM);
}